

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

int enet_socket_bind(ENetSocket socket,ENetAddress *address)

{
  int iVar1;
  in_addr_t iVar2;
  sockaddr_in6 sin;
  sockaddr local_28;
  undefined4 uStack_18;
  ulong uStack_14;
  
  if (address == (ENetAddress *)0x0) {
    local_28.sa_family = 10;
    local_28.sa_data[0] = '\0';
    local_28.sa_data[1] = '\0';
    local_28.sa_data._6_4_ = _in6addr_any;
    local_28.sa_data._10_4_ = uRam000000000010d034;
    uStack_18 = _setsockopt;
    iVar2 = uRam000000000010d03c;
  }
  else {
    local_28.sa_data._0_2_ = address->port << 8 | address->port >> 8;
    local_28.sa_family = 10;
    local_28.sa_data._6_4_ = *(undefined4 *)&address->field_0;
    local_28.sa_data._10_4_ = *(undefined4 *)((long)&address->field_0 + 4);
    uStack_18 = *(undefined4 *)((long)&address->field_0 + 8);
    iVar2 = (address->field_0).ipv4.ip.s_addr;
  }
  local_28.sa_data._2_4_ = 0;
  uStack_14 = (ulong)iVar2;
  iVar1 = bind(socket,&local_28,0x1c);
  return iVar1;
}

Assistant:

int enet_socket_bind(ENetSocket socket, const ENetAddress* address) {
	struct sockaddr_in6 sin;

	memset(&sin, 0, sizeof(struct sockaddr_in6));

	sin.sin6_family = AF_INET6;

	if (address != NULL) {
		sin.sin6_port = ENET_HOST_TO_NET_16(address->port);
		sin.sin6_addr = address->ipv6;
	}
	else {
		sin.sin6_port = 0;
		sin.sin6_addr = ENET_HOST_ANY;
	}

	return bind(socket, (struct sockaddr*)&sin, sizeof(struct sockaddr_in6));
}